

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

positionTy * __thiscall positionTy::normalize(positionTy *this)

{
  double dVar1;
  LTError *this_00;
  double dVar2;
  
  if (((this->f).field_0x1 & 0xc) == 0) {
    dVar2 = this->_lat;
    if (180.0 < dVar2) {
      this_00 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                       ,0x1a3,"normalize",logFATAL,"ASSERT FAILED: %s","lat() <= 180");
    }
    else if (dVar2 < -180.0) {
      this_00 = (LTError *)__cxa_allocate_exception(0x18);
      LTError::LTError(this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                       ,0x1a4,"normalize",logFATAL,"ASSERT FAILED: %s","lat() >= -180");
    }
    else {
      dVar1 = (double)(~-(ulong)(90.0 < dVar2) & (ulong)dVar2 |
                      (ulong)(180.0 - dVar2) & -(ulong)(90.0 < dVar2));
      if ((90.0 < dVar2) || (dVar1 < -90.0)) {
        this->_lat = (double)(~-(ulong)(dVar1 < -90.0) & (ulong)dVar1 |
                             (ulong)(dVar1 + 180.0) & -(ulong)(dVar1 < -90.0));
      }
      dVar2 = this->_lon;
      if (360.0 < dVar2) {
        this_00 = (LTError *)__cxa_allocate_exception(0x18);
        LTError::LTError(this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                         ,0x1a9,"normalize",logFATAL,"ASSERT FAILED: %s","lon() <= 360");
      }
      else {
        if (-360.0 <= dVar2) {
          dVar1 = (double)(~-(ulong)(180.0 < dVar2) & (ulong)dVar2 |
                          (ulong)(dVar2 + -360.0) & -(ulong)(180.0 < dVar2));
          if ((180.0 < dVar2) || (dVar1 < -180.0)) {
            this->_lon = (double)(~-(ulong)(dVar1 < -180.0) & (ulong)dVar1 |
                                 (ulong)(dVar1 + 360.0) & -(ulong)(dVar1 < -180.0));
          }
          dVar2 = this->_head;
          if (360.0 <= ABS(dVar2)) {
            dVar2 = fmod(dVar2,360.0);
            this->_head = dVar2;
          }
          if (dVar2 < 0.0) {
            this->_head = dVar2 + 360.0;
          }
          return this;
        }
        this_00 = (LTError *)__cxa_allocate_exception(0x18);
        LTError::LTError(this_00,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                         ,0x1aa,"normalize",logFATAL,"ASSERT FAILED: %s","lon() >= -360");
      }
    }
  }
  else {
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                     ,0x1a0,"normalize",logFATAL,"ASSERT FAILED: %s",
                     "f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD");
  }
  __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

positionTy& positionTy::normalize()
{
    LOG_ASSERT(f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD);
    
    // latitude: works for -180 <= lat <= 180
    LOG_ASSERT (lat() <= 180);
    LOG_ASSERT (lat() >= -180);
    if ( lat() >  90 ) lat() = 180-lat();      // crossed north pole
    if ( lat() < -90 ) lat() = 180+lat();      // crossed south pole
    
    // longitude: works for -360 <= lon <= 360
    LOG_ASSERT (lon() <= 360);
    LOG_ASSERT (lon() >= -360);
    if ( lon() >  180 ) lon() = lon()-360;      // crossed 180° meridian east-bound
    if ( lon() < -180 ) lon() = lon()+360;      // crossed 180° meridian west-bound
    
    // heading
    if (heading() >= 360.0 || heading() <= -360.0)  // normalize to -360 < head < 360
        heading() = std::fmod(heading(), 360.0);
    if (heading() < 0.0)                            // normalize to 0 <= head < 360
        heading() += 360.0;
    
    // return myself
    return *this;
}